

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineCommand.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_12d80::AckermannTask::start(AckermannTask *this,TaskInterface ti)

{
  AckermannKey local_70;
  KeyType local_68;
  AckermannKey local_48;
  KeyType local_40;
  AckermannTask *local_20;
  AckermannTask *this_local;
  TaskInterface ti_local;
  
  ti_local.impl = ti.ctx;
  this_local = (AckermannTask *)ti.impl;
  if (this->m != 0) {
    local_20 = this;
    if (this->n == 0) {
      AckermannKey::AckermannKey(&local_48,this->m + -1,1);
      (anonymous_namespace)::AckermannKey::operator_cast_to_KeyType
                (&local_40,(AckermannKey *)&local_48);
      llbuild::core::TaskInterface::request((TaskInterface *)&this_local,&local_40,0);
      llbuild::core::KeyType::~KeyType(&local_40);
    }
    else {
      AckermannKey::AckermannKey(&local_70,this->m,this->n + -1);
      (anonymous_namespace)::AckermannKey::operator_cast_to_KeyType
                (&local_68,(AckermannKey *)&local_70);
      llbuild::core::TaskInterface::request((TaskInterface *)&this_local,&local_68,0);
      llbuild::core::KeyType::~KeyType(&local_68);
    }
  }
  return;
}

Assistant:

virtual void start(core::TaskInterface ti) override {
    // Request the first recursive result, if necessary.
    if (m == 0) {
      ;
    } else if (n == 0) {
      ti.request(AckermannKey(m-1, 1), 0);
    } else {
      ti.request(AckermannKey(m, n-1), 0);
    }
  }